

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.cpp
# Opt level: O2

void camera_fun(int port)

{
  int __fd;
  int iVar1;
  ssize_t sVar2;
  allocator local_151;
  sockaddr_in addrRec;
  _InputArray local_140;
  undefined4 local_128 [2];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *local_120;
  undefined8 local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buff;
  Mat frame_1;
  Mat frame;
  
  addrRec.sin_family = 2;
  addrRec.sin_port = (ushort)port << 8 | (ushort)port >> 8;
  addrRec.sin_addr.s_addr = inet_addr("127.0.0.1");
  __fd = socket(2,2,0);
  if (__fd < 0) {
    printf("%d create socket fail\n",port);
    return;
  }
  iVar1 = bind(__fd,(sockaddr *)&addrRec,0x10);
  if (iVar1 < 0) {
    printf("%d bind fail\n",port);
    return;
  }
  cv::Mat::Mat(&frame);
  do {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &buff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,0x1000a,
               (allocator_type *)&frame_1);
    sVar2 = recvfrom(__fd,buff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,0x1000a,0,(sockaddr *)0x0,
                     (socklen_t *)0x0);
    if ((int)sVar2 == -1) {
      printf("recieve data fail!");
      cv::waitKey(10);
    }
    else {
      local_118 = 0;
      local_128[0] = 0x81030000;
      local_120 = &buff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
      cv::imdecode((_InputArray *)&frame_1,(int)(string *)local_128);
      std::__cxx11::string::string((string *)local_128,"receive",&local_151);
      local_140.sz.width = 0;
      local_140.sz.height = 0;
      local_140.flags = 0x1010000;
      local_140.obj = (_InputArray *)&frame_1;
      cv::imshow((string *)local_128,&local_140);
      std::__cxx11::string::~string((string *)local_128);
      cv::waitKey(1);
      cv::Mat::~Mat(&frame_1);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  } while( true );
}

Assistant:

void camera_fun(int port)
{				
	/*
		port为笔记本接收端口,注意和工控机发送端口保持一zhi
	*/
	struct sockaddr_in addrRec;
	addrRec.sin_family = AF_INET;
	addrRec.sin_port = htons(port);//port
	addrRec.sin_addr.s_addr = inet_addr("127.0.0.1");//ip
	
	int sockClient = socket(AF_INET, SOCK_DGRAM, 0);
	if(sockClient < 0){
		printf("%d create socket fail\n",port);
		return ;
	}

	int ret_bind = bind( sockClient, (struct sockaddr*)&addrRec, sizeof(sockaddr_in) );
    if(ret_bind < 0){
		printf("%d bind fail\n",port);
		return ;
	}

	struct sockaddr_in addrSend;
	int nLen = sizeof(struct sockaddr_in);
	int count;	
	Mat frame;
		
	while (1)
	{
		std::vector<uchar> buff(65546);
		count = recvfrom(sockClient,&buff[0],65546, 0, NULL,NULL);//接收压缩的数据
		if(count == -1){
			printf("recieve data fail!");
			waitKey(10);
			continue;

		}
		Mat frame = imdecode(buff, -1);//解压
		imshow("receive", frame);//显示
		waitKey(1);
	}	

	close(sockClient);

}